

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_traits.hpp
# Opt level: O0

bool __thiscall
jsoncons::typed_array_visitor<std::vector<double,_std::allocator<double>_>_>::visit_int64
          (typed_array_visitor<std::vector<double,_std::allocator<double>_>_> *this,int64_t value,
          semantic_tag param_3,ser_context *param_4,error_code *param_5)

{
  long in_RSI;
  value_type_conflict4 *in_stack_ffffffffffffffc8;
  
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)(double)in_RSI,in_stack_ffffffffffffffc8);
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_int64(int64_t value, 
            semantic_tag,
            const ser_context&,
            std::error_code&) override
        {
            v_.push_back(static_cast<value_type>(value));
            JSONCONS_VISITOR_RETURN;
        }